

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_ems_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((hs->field_0x6ca & 2) != 0) {
    iVar1 = CBB_add_u16(out,0x17);
    if (iVar1 == 0) {
      bVar2 = false;
    }
    else {
      iVar1 = CBB_add_u16(out,0);
      bVar2 = iVar1 != 0;
    }
  }
  return bVar2;
}

Assistant:

static bool ext_ems_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (!hs->extended_master_secret) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_extended_master_secret) ||
      !CBB_add_u16(out, 0 /* length */)) {
    return false;
  }

  return true;
}